

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_edge_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_INT *pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  ulong uVar8;
  REF_INT geom;
  char *pcVar9;
  int iVar10;
  int node;
  long lVar11;
  long lVar12;
  REF_INT local;
  REF_INT sens;
  REF_DBL *local_130;
  REF_DICT ref_dict;
  REF_DBL radius;
  int local_118;
  int local_114;
  REF_DBL gap;
  REF_DBL tvalue;
  ulong local_100;
  REF_DBL xyz [3];
  REF_INT nodes [27];
  REF_DBL normal [3];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  ref_geom = ref_grid->geom;
  uVar3 = ref_dict_create(&ref_dict);
  if (uVar3 != 0) {
    uVar8 = (ulong)uVar3;
    pcVar9 = "create dict";
    uVar7 = 0xb92;
    goto LAB_00155c4a;
  }
  local_114 = -1;
  lVar11 = 0;
  for (lVar12 = 0; lVar12 < ref_geom->max; lVar12 = lVar12 + 1) {
    pRVar1 = ref_geom->descr;
    iVar10 = local_114;
    if ((*(int *)((long)pRVar1 + lVar11) == 1) && (*(int *)((long)pRVar1 + lVar11 + 4) == id)) {
      uVar3 = ref_dict_store(ref_dict,*(REF_INT *)((long)pRVar1 + lVar11 + 0x14),(REF_INT)lVar12);
      if (uVar3 != 0) {
        uVar8 = (ulong)uVar3;
        pcVar9 = "mark nodes";
        uVar7 = 0xb97;
        goto LAB_00155c4a;
      }
      iVar10 = local_114;
      if ((*(int *)((long)ref_geom->descr + lVar11 + 0xc) != 0) &&
         (iVar10 = (REF_INT)lVar12, local_114 != -1)) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xb99,"ref_geom_edge_tec_zone","should be only one jump per edge",0xffffffffffffffff,
               (long)local_114);
        return 1;
      }
    }
    local_114 = iVar10;
    lVar11 = lVar11 + 0x18;
  }
  local_100 = (ulong)(uint)ref_dict->n;
  local_130 = (REF_DBL *)CONCAT44(local_130._4_4_,(uint)(local_114 != -1));
  uVar8 = 0;
  for (iVar10 = 0; iVar10 < ref_cell->max; iVar10 = iVar10 + 1) {
    RVar4 = ref_cell_nodes(ref_cell,iVar10,nodes);
    uVar8 = (ulong)((int)uVar8 + (uint)(nodes[2] == id && RVar4 == 0));
  }
  uVar3 = (int)local_100 + (int)local_130;
  if ((uVar3 == 0) || ((int)uVar8 == 0)) {
    uVar3 = ref_dict_free(ref_dict);
    if (uVar3 != 0) {
      uVar8 = (ulong)uVar3;
      pcVar9 = "free dict";
      uVar7 = 0xbaa;
      goto LAB_00155c4a;
    }
  }
  else {
    fprintf((FILE *)file,"zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            id,(ulong)uVar3,uVar8,"point","felineseg");
    if ((int)uVar3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xbb3,
             "ref_geom_edge_tec_zone","malloc t of REF_DBL negative");
      return 1;
    }
    uVar8 = (ulong)uVar3;
    pRVar6 = (REF_DBL *)malloc(uVar8 * 8);
    if (pRVar6 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xbb3,
             "ref_geom_edge_tec_zone","malloc t of REF_DBL NULL");
      return 2;
    }
    local_118 = uVar3 - 1;
    local_130 = pRVar6;
    for (iVar10 = 0; iVar10 < ref_cell->max; iVar10 = iVar10 + 1) {
      RVar4 = ref_cell_nodes(ref_cell,iVar10,nodes);
      if ((RVar4 == 0) && (nodes[2] == id)) {
        uVar5 = ref_dict_location(ref_dict,nodes[0],&local);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xbba,"ref_geom_edge_tec_zone",(ulong)uVar5,"localize");
          printf("edg %d %d id %d no edge geom\n",(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
                 (ulong)(uint)nodes[2]);
          uVar3 = ref_node_location(ref_node,nodes[0]);
          if (uVar3 == 0) {
            ref_geom_tattle(ref_geom,nodes[0]);
            return uVar5;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 3000,"ref_geom_edge_tec_zone",(ulong)uVar3,"loc");
          return uVar3;
        }
        uVar5 = ref_geom_cell_tuv(ref_geom,nodes[0],nodes,1,&tvalue,&sens);
        if (uVar5 != 0) {
          uVar8 = (ulong)uVar5;
          pcVar9 = "from";
          uVar7 = 0xbbd;
          goto LAB_00155c4a;
        }
        if (sens == -1) {
          local = local_118;
        }
        local_130[local] = tvalue;
        uVar5 = ref_dict_location(ref_dict,nodes[1],&local);
        if (uVar5 != 0) {
          uVar8 = (ulong)uVar5;
          pcVar9 = "localize";
          uVar7 = 0xbc0;
          goto LAB_00155c4a;
        }
        uVar5 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&tvalue,&sens);
        if (uVar5 != 0) {
          uVar8 = (ulong)uVar5;
          pcVar9 = "from";
          uVar7 = 0xbc3;
          goto LAB_00155c4a;
        }
        if (sens == -1) {
          local = local_118;
        }
        local_130[local] = tvalue;
      }
    }
    iVar10 = ref_dict->n;
    geom = -1;
    node = -1;
    if (0 < iVar10) {
      node = *ref_dict->key;
      geom = *ref_dict->value;
    }
    pRVar6 = local_130;
    local_100 = (ulong)uVar3;
    for (lVar11 = 1; lVar11 + -1 < (long)iVar10; lVar11 = lVar11 + 1) {
      radius = 0.0;
      gap = 0.0;
      pRVar2 = ref_node->real;
      lVar12 = (long)(node * 0xf);
      xyz[0] = pRVar2[lVar12];
      xyz[1] = pRVar2[lVar12 + 1];
      xyz[2] = pRVar2[lVar12 + 2];
      if (ref_geom->model != (void *)0x0) {
        uVar3 = ref_egads_edge_curvature(ref_geom,geom,&radius,normal);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "curve";
          uVar7 = 0xbd0;
          goto LAB_00155c4a;
        }
        if (radius <= -radius) {
          radius = -radius;
        }
        uVar3 = ref_egads_eval_at(ref_geom,1,id,pRVar6,xyz,(REF_DBL *)0x0);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "eval at";
          uVar7 = 0xbd3;
          goto LAB_00155c4a;
        }
        uVar3 = ref_egads_gap(ref_geom,node,&gap);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "gap";
          uVar7 = 0xbd4;
          goto LAB_00155c4a;
        }
      }
      fprintf((FILE *)file," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",xyz[0],xyz[1],xyz[2]
              ,gap,*pRVar6,0,radius,0);
      iVar10 = ref_dict->n;
      geom = -1;
      node = -1;
      if ((int)lVar11 < iVar10) {
        node = ref_dict->key[lVar11];
        geom = ref_dict->value[lVar11];
      }
      pRVar6 = pRVar6 + 1;
    }
    if (local_114 != -1) {
      iVar10 = ref_geom->descr[(long)(local_114 * 6) + 5];
      lVar11 = (long)iVar10;
      radius = 0.0;
      gap = 0.0;
      pRVar6 = ref_node->real;
      xyz[0] = pRVar6[lVar11 * 0xf];
      xyz[1] = pRVar6[lVar11 * 0xf + 1];
      xyz[2] = pRVar6[lVar11 * 0xf + 2];
      if (ref_geom->model != (void *)0x0) {
        uVar3 = ref_egads_edge_curvature(ref_geom,local_114,&radius,normal);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "curve";
          uVar7 = 0xbe2;
          goto LAB_00155c4a;
        }
        if (radius <= -radius) {
          radius = -radius;
        }
        uVar3 = ref_egads_eval_at(ref_geom,1,id,local_130 + (uVar8 - 1),xyz,(REF_DBL *)0x0);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "eval at";
          uVar7 = 0xbe6;
          goto LAB_00155c4a;
        }
        uVar3 = ref_egads_gap(ref_geom,iVar10,&gap);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "gap";
          uVar7 = 0xbe7;
          goto LAB_00155c4a;
        }
      }
      fprintf((FILE *)file," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",xyz[0],xyz[1],xyz[2]
              ,gap,local_130[uVar8 - 1],0,radius,0);
    }
    free(local_130);
    for (iVar10 = 0; iVar10 < ref_cell->max; iVar10 = iVar10 + 1) {
      RVar4 = ref_cell_nodes(ref_cell,iVar10,nodes);
      if ((RVar4 == 0) && (nodes[2] == id)) {
        uVar3 = ref_dict_location(ref_dict,nodes[0],&local);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "localize";
          uVar7 = 0xbf1;
          goto LAB_00155c4a;
        }
        uVar3 = ref_geom_cell_tuv(ref_geom,nodes[0],nodes,1,&tvalue,&sens);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "from";
          uVar7 = 0xbf4;
          goto LAB_00155c4a;
        }
        if (sens == -1) {
          local = local_118;
          uVar8 = local_100 & 0xffffffff;
        }
        else {
          uVar8 = (ulong)(local + 1);
        }
        fprintf((FILE *)file," %d",uVar8);
        uVar3 = ref_dict_location(ref_dict,nodes[1],&local);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "localize";
          uVar7 = 0xbf7;
          goto LAB_00155c4a;
        }
        uVar3 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&tvalue,&sens);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "from";
          uVar7 = 0xbfa;
          goto LAB_00155c4a;
        }
        if (sens == -1) {
          local = local_118;
          uVar8 = local_100 & 0xffffffff;
        }
        else {
          uVar8 = (ulong)(local + 1);
        }
        fprintf((FILE *)file," %d",uVar8);
        fputc(10,(FILE *)file);
      }
    }
    uVar3 = ref_dict_free(ref_dict);
    if (uVar3 != 0) {
      uVar8 = (ulong)uVar3;
      pcVar9 = "free dict";
      uVar7 = 0xc01;
LAB_00155c4a:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar7,
             "ref_geom_edge_tec_zone",uVar8,pcVar9);
      return (REF_STATUS)uVar8;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_edge_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, tvalue;
  REF_DBL radius, normal[3], xyz[3], gap;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[item]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, t[item], 0.0, radius, 0.0);
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[nnode - 1]), xyz,
                            NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, t[nnode - 1], 0.0, radius, 0.0);
  }
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}